

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  Lookaside *pLVar1;
  u8 uVar2;
  ushort uVar3;
  sqlite3 *db;
  Table *pTVar4;
  char *__s;
  undefined1 uVar5;
  u16 uVar6;
  int iVar7;
  uint uVar8;
  HashElem *pHVar9;
  sColMap *psVar10;
  size_t sVar11;
  Expr *pEVar12;
  Expr *pEVar13;
  Expr *pRight;
  ExprList *pEVar14;
  SrcList *pSrc;
  Schema *pSVar15;
  Select *pSVar16;
  i16 *piVar17;
  Schema **ppSVar18;
  FKey *p;
  long lVar19;
  long lVar20;
  uint uVar21;
  Trigger *p_00;
  long lVar22;
  bool bVar23;
  Select *local_f0;
  Expr *local_e8;
  ExprList *local_e0;
  Expr *local_d0;
  TriggerStep *local_c8;
  int *aiCol;
  int local_a0;
  int local_9c;
  Token tFromCol;
  Token tNew;
  Token tOld;
  Index *pIdx;
  int *local_58;
  i16 *local_50;
  sColMap *local_48;
  Token tToCol;
  
  if ((pParse->db->flags & 0x4000) != 0) {
    pHVar9 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
    p = (FKey *)pHVar9->data;
    if (p != (FKey *)0x0) {
      bVar23 = pChanges != (ExprList *)0x0;
      local_50 = &pTab->iPKey;
      local_a0 = regOld;
      local_9c = bChngRowid;
      local_58 = aChange;
      do {
        if ((aChange == (int *)0x0) ||
           (iVar7 = fkParentIsModified(pTab,p,aChange,bChngRowid), iVar7 != 0)) {
          db = pParse->db;
          uVar2 = p->aAction[bVar23];
          if ((uVar2 == '\a') && ((db->flags & 0x80000) != 0)) {
            p_00 = (Trigger *)0x0;
          }
          else {
            p_00 = p->apTrigger[bVar23];
            if ((uVar2 != '\0') && (p_00 == (Trigger *)0x0)) {
              pIdx = (Index *)0x0;
              aiCol = (int *)0x0;
              iVar7 = sqlite3FkLocateIndex(pParse,pTab,p,&pIdx,&aiCol);
              p_00 = (Trigger *)0x0;
              if (iVar7 == 0) {
                if (p->nCol < 1) {
                  local_e8 = (Expr *)0x0;
                  local_e0 = (ExprList *)0x0;
                  local_d0 = (Expr *)0x0;
                }
                else {
                  local_48 = p->aCol;
                  lVar20 = 0;
                  lVar19 = 0;
                  lVar22 = 0;
                  local_d0 = (Expr *)0x0;
                  local_e0 = (ExprList *)0x0;
                  local_e8 = (Expr *)0x0;
                  do {
                    tOld.z = "old";
                    tOld.n = 3;
                    tOld._12_4_ = 0;
                    psVar10 = (sColMap *)((long)aiCol + lVar20);
                    if (aiCol == (int *)0x0) {
                      psVar10 = local_48;
                    }
                    tNew.z = "new";
                    tNew.n = 3;
                    tNew._12_4_ = 0;
                    piVar17 = local_50;
                    if (pIdx != (Index *)0x0) {
                      piVar17 = (i16 *)((long)pIdx->aiColumn + lVar19);
                    }
                    iVar7 = psVar10->iFrom;
                    tToCol.z = pTab->aCol[*piVar17].zCnName;
                    uVar21 = 0;
                    uVar8 = 0;
                    if (tToCol.z != (char *)0x0) {
                      sVar11 = strlen(tToCol.z);
                      uVar8 = (uint)sVar11 & 0x3fffffff;
                    }
                    tFromCol.z = p->pFrom->aCol[iVar7].zCnName;
                    tToCol.n = uVar8;
                    if (tFromCol.z != (char *)0x0) {
                      sVar11 = strlen(tFromCol.z);
                      uVar21 = (uint)sVar11 & 0x3fffffff;
                    }
                    tFromCol.n = uVar21;
                    pEVar12 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                    pEVar13 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                    pEVar12 = sqlite3PExpr(pParse,0x8d,pEVar12,pEVar13);
                    pEVar13 = sqlite3ExprAlloc(db,0x3b,&tFromCol,0);
                    pEVar12 = sqlite3PExpr(pParse,0x35,pEVar12,pEVar13);
                    local_e8 = sqlite3ExprAnd(pParse,local_e8,pEVar12);
                    if (pChanges != (ExprList *)0x0) {
                      pEVar12 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                      pEVar13 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                      pEVar12 = sqlite3PExpr(pParse,0x8d,pEVar12,pEVar13);
                      pEVar13 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                      pRight = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                      pEVar13 = sqlite3PExpr(pParse,0x8d,pEVar13,pRight);
                      pEVar12 = sqlite3PExpr(pParse,0x2d,pEVar12,pEVar13);
                      local_d0 = sqlite3ExprAnd(pParse,local_d0,pEVar12);
                    }
                    if ((uVar2 != '\n' || pChanges != (ExprList *)0x0) && uVar2 != '\a') {
                      if (uVar2 == '\t') {
                        pTVar4 = p->pFrom;
                        if (((pTVar4->aCol[iVar7].colFlags & 0x60) == 0) &&
                           (uVar3 = pTVar4->aCol[iVar7].iDflt, uVar3 != 0)) {
                          if (((pTVar4->eTabType == '\0') &&
                              (pEVar14 = (pTVar4->u).tab.pDfltList, pEVar14 != (ExprList *)0x0)) &&
                             ((int)(uint)uVar3 <= pEVar14->nExpr)) {
                            pEVar12 = pEVar14->a[uVar3 - 1].pExpr;
                          }
                          else {
                            pEVar12 = (Expr *)0x0;
                          }
                        }
                        else {
                          pEVar12 = (Expr *)0x0;
                        }
                        if (pEVar12 == (Expr *)0x0) {
                          pEVar12 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
                          goto joined_r0x001ada87;
                        }
                        pEVar12 = exprDup(db,pEVar12,0,(u8 **)0x0);
                      }
                      else if (uVar2 == '\n') {
                        pEVar12 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                        pEVar13 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                        pEVar12 = sqlite3PExpr(pParse,0x8d,pEVar12,pEVar13);
                      }
                      else {
                        pEVar12 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
joined_r0x001ada87:
                        if (pEVar12 != (Expr *)0x0) {
                          pEVar12->op = '\0';
                          pEVar12->affExpr = '\0';
                          pEVar12->op2 = '\0';
                          pEVar12->field_0x3 = 0;
                          pEVar12->flags = 0;
                          (pEVar12->u).zToken = (char *)0x0;
                          pEVar12->iColumn = 0;
                          pEVar12->iAgg = 0;
                          pEVar12->w = (anon_union_4_2_009eaf8f_for_w)0x0;
                          pEVar12->pAggInfo = (AggInfo *)0x0;
                          (pEVar12->x).pList = (ExprList *)0x0;
                          pEVar12->nHeight = 0;
                          pEVar12->iTable = 0;
                          pEVar12->pLeft = (Expr *)0x0;
                          pEVar12->pRight = (Expr *)0x0;
                          (pEVar12->y).pTab = (Table *)0x0;
                          pEVar12->op = 'y';
                          pEVar12->iAgg = -1;
                          pEVar12->nHeight = 1;
                        }
                      }
                      local_e0 = sqlite3ExprListAppend(pParse,local_e0,pEVar12);
                      sqlite3ExprListSetName(pParse,local_e0,&tFromCol,0);
                    }
                    lVar22 = lVar22 + 1;
                    lVar19 = lVar19 + 2;
                    lVar20 = lVar20 + 4;
                  } while (lVar22 < p->nCol);
                }
                if (aiCol != (int *)0x0) {
                  sqlite3DbFreeNN(db,aiCol);
                }
                aChange = local_58;
                bChngRowid = local_9c;
                regOld = local_a0;
                __s = p->pFrom->zName;
                if (__s == (char *)0x0) {
                  uVar8 = 0;
                }
                else {
                  sVar11 = strlen(__s);
                  uVar8 = (uint)sVar11 & 0x3fffffff;
                }
                if (uVar2 == '\a') {
                  if (pTab->pSchema == (Schema *)0x0) {
                    lVar19 = -0x8000;
                  }
                  else {
                    lVar19 = -0x100000000;
                    ppSVar18 = &db->aDb->pSchema;
                    do {
                      lVar19 = lVar19 + 0x100000000;
                      pSVar15 = *ppSVar18;
                      ppSVar18 = ppSVar18 + 4;
                    } while (pSVar15 != pTab->pSchema);
                    lVar19 = lVar19 >> 0x20;
                  }
                  tNew.n = uVar8;
                  tFromCol.z = db->aDb[lVar19].zDbSName;
                  tNew.z = __s;
                  if (tFromCol.z == (char *)0x0) {
                    tFromCol.n = 0;
                  }
                  else {
                    sVar11 = strlen(tFromCol.z);
                    tFromCol.n = (uint)sVar11 & 0x3fffffff;
                  }
                  tOld.z = "FOREIGN KEY constraint failed";
                  tOld.n = 0x1d;
                  pEVar12 = sqlite3ExprAlloc(db,0x47,&tOld,0);
                  if (pEVar12 != (Expr *)0x0) {
                    pEVar12->affExpr = '\x02';
                  }
                  pEVar14 = sqlite3ExprListAppendNew(pParse->db,pEVar12);
                  pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,&tFromCol,&tNew);
                  local_f0 = sqlite3SelectNew(pParse,pEVar14,pSrc,local_e8,(ExprList *)0x0,
                                              (Expr *)0x0,(ExprList *)0x0,0,(Expr *)0x0);
                  local_e8 = (Expr *)0x0;
                }
                else {
                  local_f0 = (Select *)0x0;
                }
                (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
                (db->lookaside).sz = 0;
                p_00 = (Trigger *)sqlite3DbMallocZero(db,(ulong)uVar8 + 0xa9);
                if (p_00 == (Trigger *)0x0) {
                  local_c8 = (TriggerStep *)0x0;
                }
                else {
                  local_c8 = (TriggerStep *)(p_00 + 1);
                  p_00->step_list = local_c8;
                  p_00[1].pWhen = (Expr *)&p_00[2].pWhen;
                  memcpy(&p_00[2].pWhen,__s,(ulong)uVar8);
                  if (local_e8 == (Expr *)0x0) {
                    pSVar15 = (Schema *)0x0;
                  }
                  else {
                    pSVar15 = (Schema *)exprDup(db,local_e8,1,(u8 **)0x0);
                  }
                  p_00[1].pSchema = pSVar15;
                  pSVar15 = (Schema *)sqlite3ExprListDup(db,local_e0,1);
                  p_00[1].pTabSchema = pSVar15;
                  pSVar16 = sqlite3SelectDup(db,local_f0,1);
                  *(Select **)&p_00[1].op = pSVar16;
                  if (local_d0 == (Expr *)0x0) {
                    local_d0 = (Expr *)0x0;
                  }
                  else {
                    local_d0 = sqlite3PExpr(pParse,0x13,local_d0,(Expr *)0x0);
                    pEVar12 = (Expr *)0x0;
                    if (local_d0 != (Expr *)0x0) {
                      pEVar12 = exprDup(db,local_d0,1,(u8 **)0x0);
                    }
                    p_00->pWhen = pEVar12;
                  }
                }
                pLVar1 = &db->lookaside;
                pLVar1->bDisable = pLVar1->bDisable - 1;
                if (pLVar1->bDisable == 0) {
                  uVar6 = (db->lookaside).szTrue;
                }
                else {
                  uVar6 = 0;
                }
                (db->lookaside).sz = uVar6;
                if (local_e8 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(db,local_e8);
                }
                if (local_d0 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(db,local_d0);
                }
                if (local_e0 != (ExprList *)0x0) {
                  exprListDeleteNN(db,local_e0);
                }
                if (local_f0 != (Select *)0x0) {
                  clearSelect(db,local_f0,1);
                }
                if (db->mallocFailed == '\x01') {
                  fkTriggerDelete(db,p_00);
                  p_00 = (Trigger *)0x0;
                }
                else {
                  if (uVar2 == '\a') {
                    uVar5 = 0x8a;
                  }
                  else if ((uVar2 == '\n') && (pChanges == (ExprList *)0x0)) {
                    uVar5 = 0x80;
                  }
                  else {
                    uVar5 = 0x81;
                  }
                  local_c8->op = uVar5;
                  local_c8->pTrig = p_00;
                  pSVar15 = pTab->pSchema;
                  p_00->pSchema = pSVar15;
                  p_00->pTabSchema = pSVar15;
                  p->apTrigger[bVar23] = p_00;
                  p_00->op = bVar23 | 0x80;
                }
              }
            }
          }
          if (p_00 != (Trigger *)0x0) {
            sqlite3CodeRowTriggerDirect(pParse,p_00,pTab,regOld,2,0);
          }
        }
        p = p->pNextTo;
      } while (p != (FKey *)0x0);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that
  ** refer to table pTab. If there is an action associated with the FK
  ** for this operation (either update or delete), invoke the associated
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}